

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rw_socket.cpp
# Opt level: O2

bool __thiscall cppnet::RWSocket::Recv(RWSocket *this,uint32_t len)

{
  shared_ptr<cppnet::BufferQueue> *__r;
  element_type *peVar1;
  byte bVar2;
  ushort uVar3;
  uint uVar4;
  SysCallInt32Result SVar5;
  int *piVar6;
  byte bVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  bool bVar12;
  vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_> io_vec;
  shared_ptr<cppnet::CppNetBase> cppnet_base;
  _Vector_base<cppnet::Iovec,_std::allocator<cppnet::Iovec>_> local_78;
  shared_ptr<cppnet::RWSocket> local_60;
  __shared_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<cppnet::InnerBuffer,(__gnu_cxx::_Lock_policy)2> local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  std::__shared_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_50,&(this->super_Socket)._cppnet_base);
  bVar12 = false;
  if (local_50._M_ptr != (CppNetBase *)0x0) {
    uVar8 = 0x1000;
    if (len != 0) {
      uVar8 = (ulong)len;
    }
    __r = &this->_read_buffer;
    bVar2 = 0;
    iVar9 = 0;
    while( true ) {
      uVar10 = (uint)uVar8;
      bVar7 = uVar10 < 0x10000 & bVar2;
      if (bVar2 == 0) {
        uVar8 = 0;
      }
      local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_78._M_impl.super__Vector_impl_data._M_start = (Iovec *)0x0;
      local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      peVar1 = (__r->super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      uVar4 = (*(peVar1->super_InnerBuffer).super_Buffer._vptr_Buffer[0x10])(peVar1,&local_78,uVar8)
      ;
      SVar5 = OsHandle::Readv((this->super_Socket)._sock,
                              local_78._M_impl.super__Vector_impl_data._M_start,
                              (uint32_t)
                              ((ulong)((long)local_78._M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_78._M_impl.super__Vector_impl_data._M_start) >> 4)
                             );
      uVar11 = SVar5._return_value;
      if (((int)uVar11 < 0) || (0 < SVar5._errno)) break;
      if (uVar11 == 0) {
        uVar3 = 1;
        goto LAB_0010d0af;
      }
      peVar1 = (__r->super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      (*(peVar1->super_InnerBuffer).super_Buffer._vptr_Buffer[0xe])
                (peVar1,(ulong)SVar5 & 0xffffffff);
      if (uVar11 < uVar4) goto LAB_0010d04e;
      std::_Vector_base<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>::~_Vector_base(&local_78);
      bVar2 = 1;
      uVar8 = (ulong)(uVar10 << bVar7);
      iVar9 = iVar9 + uVar11;
    }
    piVar6 = __errno_location();
    if ((*piVar6 != 0xb) && (uVar3 = 2, *piVar6 != 4)) {
LAB_0010d0af:
      (*(this->super_Socket)._vptr_Socket[0x11])(this,(ulong)uVar3);
      std::_Vector_base<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>::~_Vector_base(&local_78);
      bVar12 = false;
      goto LAB_0010d0cb;
    }
    peVar1 = (__r->super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (*(peVar1->super_InnerBuffer).super_Buffer._vptr_Buffer[0xe])(peVar1,(ulong)SVar5 & 0xffffffff);
LAB_0010d04e:
    std::_Vector_base<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>::~_Vector_base(&local_78);
    std::__shared_ptr<cppnet::RWSocket,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<cppnet::RWSocket,void>
              ((__shared_ptr<cppnet::RWSocket,(__gnu_cxx::_Lock_policy)2> *)&local_60,
               (__weak_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<cppnet::RWSocket>);
    std::__shared_ptr<cppnet::InnerBuffer,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<cppnet::BufferQueue,void>
              (local_40,&__r->super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>);
    CppNetBase::OnRead(local_50._M_ptr,&local_60,(shared_ptr<cppnet::InnerBuffer> *)local_40,
                       iVar9 + uVar11);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_60.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    bVar12 = true;
  }
LAB_0010d0cb:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  return bVar12;
}

Assistant:

bool RWSocket::Recv(uint32_t len) {
    auto cppnet_base = _cppnet_base.lock();
    if (!cppnet_base) {
        return false;
    }
    if (len == 0) {
        len = __linux_read_buff_expand_len;
    }

    uint32_t off_set = 0;
    //read all data.
    uint32_t expand_buff_len = len;
    bool need_expend = false;
    while (true) {
        uint32_t expand = 0;
        if (need_expend) {
            expand = expand_buff_len;
            if (expand_buff_len < __linux_read_buff_expand_max) {
                expand_buff_len *= 2;
            }
        }

        std::vector<Iovec> io_vec;
        uint32_t buff_len = _read_buffer->GetFreeMemoryBlock(io_vec, expand);
        auto ret = OsHandle::Readv(_sock, &*io_vec.begin(), io_vec.size());
        if (ret._return_value < 0 || ret._errno > 0) {
            if (errno == EWOULDBLOCK || errno == EAGAIN || errno == EINTR) {
                _read_buffer->MoveWritePt(ret._return_value);
                off_set += ret._return_value;
                break;

            } else {
                OnDisConnect(CEC_CONNECT_BREAK);
                return false;
            }

        } else if (ret._return_value == 0) {
            OnDisConnect(CEC_CLOSED);
            return false;

        } else {
            _read_buffer->MoveWritePt(ret._return_value);
            off_set += ret._return_value;
            // read all
            if ((uint32_t)ret._return_value < buff_len) {
                break;
            }
            need_expend = true;
        }
    }
    cppnet_base->OnRead(shared_from_this(), _read_buffer, off_set);
    return true;
}